

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O3

void add_intrinsic_4f_sc_3f_3f_3f(Context_conflict *ctx,char *fn)

{
  int iVar1;
  MOJOSHADER_astDataType *pMVar2;
  void *value;
  MOJOSHADER_astDataType *local_38;
  MOJOSHADER_astDataType *local_30;
  MOJOSHADER_astDataType *local_28;
  MOJOSHADER_astDataType *local_20;
  
  iVar1 = hash_find((ctx->usertypes).hash,"float4",&local_38);
  if ((iVar1 == 0) || (local_38 == (MOJOSHADER_astDataType *)0x0)) {
    pMVar2 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    pMVar2 = (local_38->array).base;
  }
  iVar1 = hash_find((ctx->usertypes).hash,"float3",&local_38);
  if ((iVar1 == 0) || (local_38 == (MOJOSHADER_astDataType *)0x0)) {
    local_30 = (MOJOSHADER_astDataType *)0x0;
  }
  else {
    local_30 = (local_38->array).base;
  }
  local_38 = &ctx->dt_samplercube;
  local_28 = local_30;
  local_20 = local_30;
  pMVar2 = build_function_datatype(ctx,pMVar2,4,&local_38,1);
  push_function(ctx,fn,pMVar2,0);
  return;
}

Assistant:

static void add_intrinsic_4f_sc_3f_3f_3f(Context *ctx, const char *fn)
{
    const MOJOSHADER_astDataType *f4 = get_usertype(ctx, "float4");
    const MOJOSHADER_astDataType *f3 = get_usertype(ctx, "float3");
    add_intrinsic4(ctx, fn, f4, &ctx->dt_samplercube, f3, f3, f3);
}